

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

optional<long_long> __thiscall
QNetworkHeadersPrivate::toInt(QNetworkHeadersPrivate *this,QByteArrayView value)

{
  _Storage<long_long,_true> _Var1;
  ulong uVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  optional<long_long> oVar4;
  _Storage<long_long,_true> local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  _Storage<long_long,_true> local_10;
  
  _Var1 = (_Storage<long_long,_true>)((_Storage<long_long,_true> *)(in_FS_OFFSET + 0x28))->_M_value;
  local_10 = _Var1;
  if (this == (QNetworkHeadersPrivate *)0x0) {
    uVar2 = 0;
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_28._M_value = (longlong)&DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    QVar3.m_data = (storage_type *)this;
    QVar3.m_size = (qsizetype)&local_28;
    QtPrivate::toSignedInteger(QVar3,(int)value.m_size);
    _Var1 = local_28;
    if (((ulong)puStack_20 & 1) != 0) {
      _Var1._M_value = 0;
    }
    uVar2 = (ulong)CONCAT31((int3)((ulong)puStack_20 >> 8),~(byte)puStack_20) & 0xffffffffffffff01;
  }
  if (*(undefined1 **)(in_FS_OFFSET + 0x28) != (undefined1 *)local_10._M_value) {
    __stack_chk_fail();
  }
  oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._8_8_ = uVar2;
  oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value = _Var1._M_value;
  return (optional<long_long>)
         oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

std::optional<qint64> QNetworkHeadersPrivate::toInt(QByteArrayView value)
{
    if (value.empty())
        return std::nullopt;

    bool ok;
    qint64 res = value.toLongLong(&ok);
    if (ok)
        return res;
    return std::nullopt;
}